

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

void mc_flow_dispenser(AV1_COMP *cpi)

{
  BLOCK_SIZE BVar1;
  uint mi_height_00;
  long *in_RDI;
  int mi_row;
  int mi_height;
  TX_SIZE tx_size;
  BLOCK_SIZE bsize;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  ThreadData_conflict *td;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  BLOCK_SIZE in_stack_000000f3;
  int in_stack_000000f4;
  MACROBLOCK *in_stack_000000f8;
  TplBuffers *in_stack_00000100;
  TplTxfmStats *in_stack_00000108;
  AV1_COMP *in_stack_00000110;
  TX_SIZE in_stack_00000120;
  int local_3c;
  
  BVar1 = convert_length_to_bsize((uint)*(byte *)(*in_RDI + 0xd2ad));
  mi_height_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [BVar1];
  for (local_3c = 0; local_3c < *(int *)((long)in_RDI + 0x3c194); local_3c = mi_height_00 + local_3c
      ) {
    av1_set_mv_row_limits
              ((CommonModeInfoParams *)(in_RDI + 0x7831),(FullMvLimits *)((long)in_RDI + 0x34714),
               local_3c,mi_height_00,*(int *)(*in_RDI + 0x12350));
    *(int *)((long)in_RDI + 0x170cc) = local_3c * -0x20;
    *(uint *)(in_RDI + 0x2e1a) =
         ((*(int *)((long)in_RDI + 0x3c194) - mi_height_00) - local_3c) * 0x20;
    av1_mc_flow_dispenser_row
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f4,in_stack_000000f3,in_stack_00000120);
  }
  return;
}

Assistant:

static inline void mc_flow_dispenser(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  ThreadData *td = &cpi->td;
  MACROBLOCK *x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE bsize =
      convert_length_to_bsize(cpi->ppi->tpl_data.tpl_bsize_1d);
  const TX_SIZE tx_size = max_txsize_lookup[bsize];
  const int mi_height = mi_size_high[bsize];
  for (int mi_row = 0; mi_row < mi_params->mi_rows; mi_row += mi_height) {
    // Motion estimation row boundary
    av1_set_mv_row_limits(mi_params, &x->mv_limits, mi_row, mi_height,
                          cpi->ppi->tpl_data.border_in_pixels);
    xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
    xd->mb_to_bottom_edge =
        GET_MV_SUBPEL((mi_params->mi_rows - mi_height - mi_row) * MI_SIZE);
    av1_mc_flow_dispenser_row(cpi, &td->tpl_txfm_stats, &td->tpl_tmp_buffers, x,
                              mi_row, bsize, tx_size);
  }
}